

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsysmp.cpp
# Opt level: O1

void __thiscall
TPZSYsmpMatrix<double>::TPZSYsmpMatrix(TPZSYsmpMatrix<double> *this,int64_t rows,int64_t cols)

{
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow = rows;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol = cols;
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZSYsmpMatrix_0187ce50;
  (this->fIA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fIA).fStore = (long *)0x0;
  (this->fIA).fNElements = 0;
  (this->fIA).fNAlloc = 0;
  (this->fJA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b5f0;
  (this->fJA).fStore = (long *)0x0;
  (this->fJA).fNElements = 0;
  (this->fJA).fNAlloc = 0;
  (this->fA)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fA).fStore = (double *)0x0;
  (this->fA).fNElements = 0;
  (this->fA).fNAlloc = 0;
  TPZPardisoSolver<double>::TPZPardisoSolver(&this->fPardisoControl);
  (this->fDiag)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
  (this->fDiag).fStore = (double *)0x0;
  (this->fDiag).fNElements = 0;
  (this->fDiag).fNAlloc = 0;
  return;
}

Assistant:

TPZSYsmpMatrix<TVar>::TPZSYsmpMatrix(const int64_t rows,const int64_t cols ) : TPZRegisterClassId(&TPZSYsmpMatrix::ClassId),
TPZMatrix<TVar>(rows,cols) {

#ifdef CONSTRUCTOR
	cerr << "TPZSYsmpMatrix(int rows,int cols)\n";
#endif
}